

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall GraphLibrary::Graph::add_edge(Graph *this,Node v,Node w)

{
  uint local_20;
  Node local_1c;
  
  local_20 = w;
  local_1c = v;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((this->m_adjacency_lists).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + v,&local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((this->m_adjacency_lists).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_20,&local_1c);
  this->m_num_edges = this->m_num_edges + 1;
  return;
}

Assistant:

void Graph::add_edge(const Node v, const Node w) {
        m_adjacency_lists[v].push_back(w);
        m_adjacency_lists[w].push_back(v);

        m_num_edges++;
    }